

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bitstr.cc
# Opt level: O0

int asn1_marshal_bit_string(CBB *out,ASN1_BIT_STRING *in,CBS_ASN1_TAG tag)

{
  int iVar1;
  bool local_65;
  CBS_ASN1_TAG local_64;
  uint8_t *local_60;
  uint8_t *ptr;
  CBB child;
  int len;
  CBS_ASN1_TAG tag_local;
  ASN1_BIT_STRING *in_local;
  CBB *out_local;
  
  child.u._28_4_ = tag;
  child.u._24_4_ = i2c_ASN1_BIT_STRING((ASN1_BIT_STRING *)in,(uchar **)0x0);
  if ((int)child.u._24_4_ < 1) {
    out_local._4_4_ = 0;
  }
  else {
    if (child.u._28_4_ == 0) {
      local_64 = 3;
    }
    else {
      local_64 = child.u._28_4_;
    }
    child.u._28_4_ = local_64;
    iVar1 = CBB_add_asn1(out,(CBB *)&ptr,local_64);
    local_65 = false;
    if (iVar1 != 0) {
      iVar1 = CBB_add_space((CBB *)&ptr,&local_60,(long)(int)child.u._24_4_);
      local_65 = false;
      if (iVar1 != 0) {
        iVar1 = i2c_ASN1_BIT_STRING((ASN1_BIT_STRING *)in,&local_60);
        local_65 = false;
        if (iVar1 == child.u._24_4_) {
          iVar1 = CBB_flush(out);
          local_65 = iVar1 != 0;
        }
      }
    }
    out_local._4_4_ = (uint)local_65;
  }
  return out_local._4_4_;
}

Assistant:

int asn1_marshal_bit_string(CBB *out, const ASN1_BIT_STRING *in,
                            CBS_ASN1_TAG tag) {
  int len = i2c_ASN1_BIT_STRING(in, nullptr);
  if (len <= 0) {
    return 0;
  }
  tag = tag == 0 ? CBS_ASN1_BITSTRING : tag;
  CBB child;
  uint8_t *ptr;
  return CBB_add_asn1(out, &child, tag) &&                         //
         CBB_add_space(&child, &ptr, static_cast<size_t>(len)) &&  //
         i2c_ASN1_BIT_STRING(in, &ptr) == len &&                   //
         CBB_flush(out);
}